

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O1

randomx_cache * randomx_alloc_cache(randomx_flags flags)

{
  char *pcVar1;
  randomx_cache *cache;
  JitCompilerX86 *pJVar2;
  uint8_t *puVar3;
  undefined *puVar4;
  char cVar5;
  long lVar6;
  int extraout_EDX;
  undefined1 *puVar7;
  long unaff_RBP;
  randomx_cache *prVar8;
  uint *puVar9;
  ulong uVar10;
  code *pcVar11;
  
  puVar7 = &stack0xffffffffffffffd8;
  if ((flags & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT) {
    if ((flags & RANDOMX_FLAG_ARGON2_SSSE3) == RANDOMX_FLAG_DEFAULT) {
      pcVar11 = randomx_argon2_fill_segment_ref;
    }
    else {
      pcVar11 = randomx_argon2_impl_ssse3();
    }
  }
  else {
    pcVar11 = randomx_argon2_impl_avx2();
  }
  if ((Instruction)pcVar11 == (Instruction)0x0) {
    return (randomx_cache *)0x0;
  }
  cache = (randomx_cache *)operator_new(0x83a8);
  puVar9 = (uint *)&(cache->cacheKey).field_2;
  prVar8 = cache;
  memset(cache,0,0x83a8);
  (cache->cacheKey)._M_dataplus._M_p = (pointer)puVar9;
  (cache->cacheKey)._M_string_length = 0;
  (cache->cacheKey).field_2._M_local_buf[0] = '\0';
  cache->argonImpl = pcVar11;
  uVar10 = (ulong)(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES));
  lVar6 = (long)(int)(&switchD_0011e538::switchdataD_0012d9a0)[uVar10];
  cVar5 = (char)((long)&switchD_0011e538::switchdataD_0012d9a0 + lVar6);
  switch(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES)) {
  case RANDOMX_FLAG_DEFAULT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    cache->datasetInit = randomx::initDataset;
    puVar3 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
    goto LAB_0011e642;
  case RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    cache->datasetInit = randomx::initDataset;
    puVar3 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
    goto LAB_0011e642;
  default:
    operator_delete(puVar9);
    if (extraout_EDX == 1) {
      __cxa_begin_catch(&switchD_0011e538::switchdataD_0012d9a0);
      if (cache != (randomx_cache *)0x0) {
        randomx_release_cache(cache);
      }
      __cxa_end_catch();
      return (randomx_cache *)0x0;
    }
    _Unwind_Resume(&switchD_0011e538::switchdataD_0012d9a0);
  case RANDOMX_FLAG_JIT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    pJVar2 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar2);
    cache->jit = pJVar2;
    cache->initialize = randomx::initCacheCompile;
    cache->datasetInit = (DatasetInitFunc *)pJVar2->code;
    puVar3 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
    goto LAB_0011e642;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    pJVar2 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar2);
    cache->jit = pJVar2;
    cache->initialize = randomx::initCacheCompile;
    cache->datasetInit = (DatasetInitFunc *)pJVar2->code;
    puVar3 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
LAB_0011e642:
    cache->memory = puVar3;
    return cache;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
    if ((ulong)((long)&switchD_0011e538::switchdataD_0012d9a0 + lVar6) < 2) {
      return (randomx_cache *)(ulong)*(uint *)&prVar8->memory;
    }
    prVar8 = cache + 1;
    prVar8->programs[0].programBuffer[0x135].opcode = '\0';
    prVar8->programs[0].programBuffer[0x135].dst = '\0';
    prVar8->programs[0].programBuffer[0x135].src = '\0';
    prVar8->programs[0].programBuffer[0x135].mod = '\0';
    prVar8->programs[0].programBuffer[0x135].imm32 = 0;
    prVar8 = cache + 1;
    prVar8->programs[0].programBuffer[0x136].opcode = '\0';
    prVar8->programs[0].programBuffer[0x136].dst = '\0';
    prVar8->programs[0].programBuffer[0x136].src = '\0';
    prVar8->programs[0].programBuffer[0x136].mod = '\0';
    prVar8->programs[0].programBuffer[0x136].imm32 = 0;
    cache[1].programs[0].programBuffer[0x137] = (Instruction)pcVar11;
    cache[1].programs[0].programBuffer[0x139] =
         (Instruction)(cache[1].programs[0].programBuffer + 0x13b);
    cache[1].programs[0].programBuffer[0x13a] = (Instruction)pcVar11;
    cache[1].programs[0].programBuffer[0x13b].opcode = '\0';
    puVar4 = &randomx::InterpretedLightVm<randomx::AlignedAllocator<64ul>,true>::vtable;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    switchD_0011e538::switchdataD_0012d9a0 = 0xffffdbba;
    pcVar1 = (char *)((long)lutDec3 + lVar6 + 0x389);
    *pcVar1 = *pcVar1 + cVar5;
    *(char *)(unaff_RBP + -0x77) = *(char *)(unaff_RBP + -0x77) + cVar5;
    puVar7 = (undefined1 *)0xa1024;
    pcVar1 = (char *)((long)lutDec3 + lVar6 + 0x3c6);
    *pcVar1 = *pcVar1 + -0x46;
    UINT_0012d9fc._3_1_ = 0xfe;
    puVar4 = &randomx::InterpretedVm<randomx::LargePageAllocator,false>::vtable;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
    switchD_0011e538::switchdataD_0012d9a0 =
         CONCAT31(switchD_0011e538::switchdataD_0012d9a0._1_3_,0x3a);
    puVar9 = &switchD_0011e538::switchdataD_0012d9a0;
    memset(&switchD_0011e538::switchdataD_0012d9a0,0,0xac0);
    randomx::CompiledVm<randomx::LargePageAllocator,_true,_false>::CompiledVm
              ((CompiledVm<randomx::LargePageAllocator,_true,_false> *)
               &switchD_0011e538::switchdataD_0012d9a0);
    puVar4 = &randomx::CompiledLightVm<randomx::LargePageAllocator,true,false>::vtable;
    puVar7 = &stack0xffffffffffffffd8;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    *(char *)(unaff_RBP + 0x31) = *(char *)(unaff_RBP + 0x31) + -0x60;
    lutDec3._1014_4_ = 0x5c6cd571;
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    switchD_0011e538::switchdataD_0012d9a0 =
         CONCAT31(switchD_0011e538::switchdataD_0012d9a0._1_3_,0x3a);
    puVar9 = &switchD_0011e538::switchdataD_0012d9a0;
    memset(&switchD_0011e538::switchdataD_0012d9a0,0,0xac0);
    randomx::CompiledVm<randomx::LargePageAllocator,_false,_false>::CompiledVm
              ((CompiledVm<randomx::LargePageAllocator,_false,_false> *)
               &switchD_0011e538::switchdataD_0012d9a0);
    puVar4 = &randomx::CompiledLightVm<randomx::LargePageAllocator,false,false>::vtable;
    puVar7 = &stack0xffffffffffffffd8;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    switchD_0011e538::switchdataD_0012d9a0 = 0xffffdbba;
    pcVar1 = (char *)((long)lutDec3 + lVar6 + 0x389);
    *pcVar1 = *pcVar1 + cVar5;
    *(char *)(unaff_RBP + -0x77) = *(char *)(unaff_RBP + -0x77) + cVar5;
    pcVar1 = (char *)((long)lutDec3 + lVar6 + 0x3c6);
    *pcVar1 = *pcVar1 + -0x46;
    UINT_0012d9fc._3_1_ = 0xfe;
    puVar4 = &randomx::InterpretedLightVm<randomx::LargePageAllocator,true>::vtable;
    puVar7 = (undefined1 *)0xa1024;
  }
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&((randomx_cache *)puVar9)->memory)->_M_allocated_capacity = (size_type)(puVar4 + 0x10);
  if (uVar10 != 0) {
    pcVar11 = *(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&((randomx_cache *)puVar9)->memory)->_M_allocated_capacity + 0x30);
    *(undefined8 *)(puVar7 + -8) = 0x11ee92;
    (*pcVar11)(puVar9,uVar10);
    *(undefined8 *)(puVar7 + -8) = 0x11eea8;
    std::__cxx11::string::_M_assign
              ((string *)(((randomx_cache *)puVar9)->programs[0].programBuffer + 0x13c));
  }
  if (cache != (randomx_cache *)0x0) {
    pcVar11 = *(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&((randomx_cache *)puVar9)->memory)->_M_allocated_capacity + 0x28);
    *(undefined8 *)(puVar7 + -8) = 0x11eeb9;
    (*pcVar11)(puVar9,cache);
  }
  pcVar11 = *(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&((randomx_cache *)puVar9)->memory)->_M_allocated_capacity + 0x10);
  *(undefined8 *)(puVar7 + -8) = 0x11eec2;
  (*pcVar11)(puVar9);
  return (randomx_cache *)puVar9;
}

Assistant:

randomx_cache *randomx_alloc_cache(randomx_flags flags) {
		randomx_cache *cache = nullptr;
		auto impl = randomx::selectArgonImpl(flags);
		if (impl == nullptr) {
			return cache;
		}

		try {
			cache = new randomx_cache();
			cache->argonImpl = impl;
			switch ((int)(flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES))) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				randomx_release_cache(cache);
				cache = nullptr;
			}
		}

		return cache;
	}